

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

Value * anon_unknown.dwarf_15a38eb::ReadJson(Value *__return_storage_ptr__,string *jsonstr)

{
  pointer pcVar1;
  optional<(anonymous_namespace)::Args> errorPath;
  int iVar2;
  Value *this;
  CharReader *pCVar3;
  Value *extraout_RAX;
  json_error *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  string error;
  CharReaderBuilder builder;
  ValueHolder local_b8;
  size_type local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  String local_90;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60;
  uint7 uStack_5f;
  CharReaderBuilder local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_58);
  Json::Value::Value((Value *)&local_b8,false);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"collectComments","");
  this = Json::CharReaderBuilder::operator[](&local_58,&local_90);
  Json::Value::operator=(this,(Value *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value((Value *)&local_b8);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_58);
  Json::Value::Value(__return_storage_ptr__,nullValue);
  local_b0 = 0;
  local_a8 = 0;
  pcVar1 = (jsonstr->_M_dataplus)._M_p;
  local_b8.string_ = &local_a8;
  iVar2 = (*pCVar3->_vptr_CharReader[2])
                    (pCVar3,pcVar1,pcVar1 + jsonstr->_M_string_length,__return_storage_ptr__,
                     &local_b8);
  if ((char)iVar2 != '\0') {
    if (local_b8 != &local_a8) {
      operator_delete(local_b8.string_,CONCAT71(uStack_a7,local_a8) + 1);
    }
    (*pCVar3->_vptr_CharReader[1])(pCVar3);
    Json::CharReaderBuilder::~CharReaderBuilder(&local_58);
    return extraout_RAX;
  }
  this_00 = (json_error *)__cxa_allocate_exception(0x28);
  local_90._M_dataplus._M_p = (pointer)0x1c;
  local_90._M_string_length = 0x77d074;
  local_90.field_2._M_allocated_capacity = local_b0;
  local_90.field_2._8_8_ = local_b8;
  local_60 = 0;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )uStack_68;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )local_70;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_5f << 8;
  message._M_len = 2;
  message._M_array = (iterator)&local_90;
  json_error::json_error(this_00,message,errorPath);
  __cxa_throw(this_00,&(anonymous_namespace)::json_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

Json::Value ReadJson(const std::string& jsonstr)
{
  Json::CharReaderBuilder builder;
  builder["collectComments"] = false;
  auto jsonReader = std::unique_ptr<Json::CharReader>(builder.newCharReader());
  Json::Value json;
  std::string error;
  if (!jsonReader->parse(jsonstr.data(), jsonstr.data() + jsonstr.size(),
                         &json, &error)) {
    throw json_error({ "failed parsing json string: "_s, error });
  }
  return json;
}